

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPClient.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  sockaddr_in servaddr;
  char buff [4096];
  
  iVar1 = socket(2,1,0);
  bzero(&servaddr,0x10);
  servaddr.sin_family = 2;
  servaddr.sin_port = 0x981f;
  inet_pton(2,"127.0.0.1",&servaddr.sin_addr);
  buff[0] = '\0';
  iVar2 = connect(iVar1,(sockaddr *)&servaddr,0x10);
  if (iVar2 == 0) {
    setSocketNonBlocking1(iVar1);
    poVar3 = std::operator<<((ostream *)&std::cout,"=========1:");
    std::endl<char,std::char_traits<char>>(poVar3);
    write(iVar1," ",1);
    poVar3 = std::operator<<((ostream *)&std::cout,"strlen(p) = ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    sleep(1);
    read(iVar1,buff,0x1000);
    poVar3 = std::operator<<((ostream *)&std::cout,"n=");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    printf("%s",buff);
    close(iVar1);
  }
  else {
    perror("err1");
  }
  sleep(1);
  iVar1 = socket(2,1,0);
  iVar2 = connect(iVar1,(sockaddr *)&servaddr,0x10);
  if (iVar2 == 0) {
    setSocketNonBlocking1(iVar1);
    poVar3 = std::operator<<((ostream *)&std::cout,"=========2:");
    std::endl<char,std::char_traits<char>>(poVar3);
    write(iVar1,"GET  HTTP/1.1",0xd);
    poVar3 = std::operator<<((ostream *)&std::cout,"strlen(p) = ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    sleep(1);
    read(iVar1,buff,0x1000);
    poVar3 = std::operator<<((ostream *)&std::cout,"n=");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    printf("%s",buff);
    close(iVar1);
  }
  else {
    perror("err2");
  }
  sleep(1);
  iVar1 = socket(2,1,0);
  iVar2 = connect(iVar1,(sockaddr *)&servaddr,0x10);
  if (iVar2 == 0) {
    setSocketNonBlocking1(iVar1);
    poVar3 = std::operator<<((ostream *)&std::cout,"========3:");
    std::endl<char,std::char_traits<char>>(poVar3);
    write(iVar1,
          "GET / HTTP/1.1\r\nHost: 192.168.52.135:8088\r\nContent-Type: application/x-www-form-urlencoded\r\nConnection: Keep-Alive\r\n\r\n"
          ,0x76);
    poVar3 = std::operator<<((ostream *)&std::cout,"strlen(p) = ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    sleep(1);
    read(iVar1,buff,0x1000);
    poVar3 = std::operator<<((ostream *)&std::cout,"n=");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    printf("%s",buff);
    close(iVar1);
  }
  else {
    perror("err3");
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  int sockfd;
  struct sockaddr_in servaddr;

  sockfd = socket(AF_INET, SOCK_STREAM, 0);

  bzero(&servaddr, sizeof(servaddr));
  servaddr.sin_family = AF_INET;
  servaddr.sin_port = htons(SERV_PORT);
  inet_pton(AF_INET, IPADDRESS, &servaddr.sin_addr);
  // inet_pton(AF_INET, const char *__restrict __cp, void *__restrict __buf);

  char buff[4096];
  buff[0] = '\0';

  // 发空串
  const char *p = " ";
  if (connect(sockfd, (struct sockaddr *)&servaddr, sizeof(servaddr)) == 0) {
    setSocketNonBlocking1(sockfd);
    cout << "=========1:" << endl;
    ssize_t n = write(sockfd, p, strlen(p));
    cout << "strlen(p) = " << strlen(p) << endl;
    sleep(1);
    n = read(sockfd, buff, 4096);
    cout << "n=" << n << endl;
    printf("%s", buff);
    close(sockfd);
  } else {
    perror("err1");
  }
  sleep(1);


  // 发"GET  HTTP/1.1"
  p = "GET  HTTP/1.1";
  sockfd = socket(AF_INET, SOCK_STREAM, 0);
  if (connect(sockfd, (struct sockaddr *)&servaddr, sizeof(servaddr)) == 0) {
    setSocketNonBlocking1(sockfd);
    cout << "=========2:" << endl;
    ssize_t n = write(sockfd, p, strlen(p));
    cout << "strlen(p) = " << strlen(p) << endl;
    sleep(1);
    n = read(sockfd, buff, 4096);
    cout << "n=" << n << endl;
    printf("%s", buff);
    close(sockfd);
  } else {
    perror("err2");
  }
  sleep(1);

  // 发
  // GET  HTTP/1.1
  // Host: 192.168.52.135:8088
  // Content-Type: application/x-www-form-urlencoded
  // Connection: Keep-Alive
  p = "GET / HTTP/1.1\r\nHost: 192.168.52.135:8088\r\nContent-Type: "
      "application/x-www-form-urlencoded\r\nConnection: Keep-Alive\r\n\r\n";
  sockfd = socket(AF_INET, SOCK_STREAM, 0);
  if (connect(sockfd, (struct sockaddr *)&servaddr, sizeof(servaddr)) == 0) {
    setSocketNonBlocking1(sockfd);
    cout << "========3:" << endl;
    ssize_t n = write(sockfd, p, strlen(p));
    cout << "strlen(p) = " << strlen(p) << endl;
    sleep(1);
    n = read(sockfd, buff, 4096);
    cout << "n=" << n << endl;
    printf("%s", buff);
    close(sockfd);
  } else {
    perror("err3");
  }
  
  return 0;
}